

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O2

void __thiscall Imf_3_4::TimeCode::setHours(TimeCode *this,int value)

{
  ArgExc *this_00;
  
  if ((uint)value < 0x18) {
    this->_time = (uint)(byte)((char)value + (char)(((ushort)value & 0xff) / 10) * '\x06') << 0x18 |
                  this->_time & 0xc0ffffff;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Cannot set hours field in time code. New value is out of range.")
  ;
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TimeCode::setHours (int value)
{
    if (value < 0 || value > 23)
        throw IEX_NAMESPACE::ArgExc ("Cannot set hours field in time code. "
                                     "New value is out of range.");

    setBitField (_time, 24, 29, binaryToBcd (value));
}